

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_geom.cxx
# Opt level: O0

void __thiscall xray_re::xr_level_geom::load_1865(xr_level_geom *this,xr_reader *r)

{
  xr_vbuf_vec_it xVar1;
  bool bVar2;
  uint32_t uVar3;
  d3d_vertex_element *ve_00;
  d3d_vertex_element *pdVar4;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  __normal_iterator<xray_re::xr_swibuf_*,_std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>_>
  local_60;
  xr_swibuf_vec_it end_2;
  xr_swibuf_vec_it it_2;
  xr_ibuf_vec_it end_1;
  xr_ibuf_vec_it it_1;
  size_t n_ve;
  d3d_vertex_element *ve;
  xr_vbuf_vec_it end;
  xr_vbuf_vec_it it;
  xr_reader *s;
  xr_reader *r_local;
  xr_level_geom *this_local;
  
  it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,10);
  if (it._M_current == (xr_vbuf *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                  ,0x37,"void xray_re::xr_level_geom::load_1865(xr_reader &)");
  }
  uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
  std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::resize
            (&this->m_vbufs,(ulong)uVar3);
  end._M_current =
       (xr_vbuf *)
       std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::begin(&this->m_vbufs);
  ve = (d3d_vertex_element *)
       std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>::end(&this->m_vbufs);
  while( true ) {
    bVar2 = __gnu_cxx::operator!=
                      (&end,(__normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
                             *)&ve);
    if (!bVar2) break;
    ve_00 = xr_reader::skip<xray_re::d3d_vertex_element>((xr_reader *)it._M_current,1);
    it_1._M_current = (xr_ibuf *)0x1;
    while( true ) {
      pdVar4 = xr_reader::skip<xray_re::d3d_vertex_element>((xr_reader *)it._M_current,1);
      if (pdVar4->type == '\x11') break;
      it_1._M_current =
           (xr_ibuf *)((long)&((it_1._M_current)->super_xr_flexbuf)._vptr_xr_flexbuf + 1);
    }
    this_00 = __gnu_cxx::
              __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
              ::operator->(&end);
    xVar1 = it;
    uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
    xr_vbuf::load_d3d9(this_00,(xr_reader *)xVar1._M_current,(ulong)uVar3,ve_00,
                       (size_t)it_1._M_current);
    __gnu_cxx::
    __normal_iterator<xray_re::xr_vbuf_*,_std::vector<xray_re::xr_vbuf,_std::allocator<xray_re::xr_vbuf>_>_>
    ::operator++(&end);
  }
  xr_reader::close_chunk(r,(xr_reader **)&it);
  it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,9);
  if (it._M_current != (xr_vbuf *)0x0) {
    uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
    std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::resize
              (&this->m_ibufs,(ulong)uVar3);
    end_1._M_current =
         (xr_ibuf *)
         std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::begin(&this->m_ibufs);
    it_2._M_current =
         (xr_swibuf *)
         std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>::end(&this->m_ibufs);
    while( true ) {
      bVar2 = __gnu_cxx::operator!=
                        (&end_1,(__normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
                                 *)&it_2);
      if (!bVar2) break;
      this_01 = __gnu_cxx::
                __normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
                ::operator->(&end_1);
      xVar1 = it;
      uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
      xr_ibuf::load(this_01,(xr_reader *)xVar1._M_current,(ulong)uVar3);
      __gnu_cxx::
      __normal_iterator<xray_re::xr_ibuf_*,_std::vector<xray_re::xr_ibuf,_std::allocator<xray_re::xr_ibuf>_>_>
      ::operator++(&end_1);
    }
    xr_reader::close_chunk(r,(xr_reader **)&it);
    it._M_current = (xr_vbuf *)xr_reader::open_chunk(r,0xb);
    if (it._M_current != (xr_vbuf *)0x0) {
      uVar3 = xr_reader::r_u32((xr_reader *)it._M_current);
      std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::resize
                (&this->m_swibufs,(ulong)uVar3);
      end_2._M_current =
           (xr_swibuf *)
           std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::begin
                     (&this->m_swibufs);
      local_60._M_current =
           (xr_swibuf *)
           std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>::end
                     (&this->m_swibufs);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=(&end_2,&local_60);
        if (!bVar2) break;
        this_02 = __gnu_cxx::
                  __normal_iterator<xray_re::xr_swibuf_*,_std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>_>
                  ::operator->(&end_2);
        xr_swibuf::load(this_02,(xr_reader *)it._M_current);
        __gnu_cxx::
        __normal_iterator<xray_re::xr_swibuf_*,_std::vector<xray_re::xr_swibuf,_std::allocator<xray_re::xr_swibuf>_>_>
        ::operator++(&end_2);
      }
      xr_reader::close_chunk(r,(xr_reader **)&it);
    }
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_geom.cxx"
                ,0x42,"void xray_re::xr_level_geom::load_1865(xr_reader &)");
}

Assistant:

void xr_level_geom::load_1865(xr_reader& r)
{
	xr_reader* s = r.open_chunk(FSL12_VB);
	xr_assert(s);
	m_vbufs.resize(s->r_u32());
	for (xr_vbuf_vec_it it = m_vbufs.begin(), end = m_vbufs.end(); it != end; ++it) {
		const d3d_vertex_element *ve = s->skip<d3d_vertex_element>();
		size_t n_ve = 1;
		for (; s->skip<d3d_vertex_element>()->type != D3D_VE_TYPE_UNUSED; ++n_ve) {}
		it->load_d3d9(*s, s->r_u32(), ve, n_ve);
	}
	r.close_chunk(s);

	s = r.open_chunk(FSL12_IB);
	xr_assert(s);
	m_ibufs.resize(s->r_u32());
	for (xr_ibuf_vec_it it = m_ibufs.begin(), end = m_ibufs.end(); it != end; ++it)
		it->load(*s, s->r_u32());
	r.close_chunk(s);

	s = r.open_chunk(FSL12_SWIS);
	if (s != 0)
	{
		m_swibufs.resize(s->r_u32());
		for (xr_swibuf_vec_it it = m_swibufs.begin(), end = m_swibufs.end(); it != end; ++it)
			it->load(*s);
		r.close_chunk(s);
	}
}